

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_setup_encoder(opj_j2k_t *j2k,opj_cparameters_t *parameters,opj_image_t *image)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int a;
  int *piVar4;
  size_t sVar5;
  void *pvVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int size_prch;
  int size_prcw;
  int res_spec;
  int p;
  opj_tccp_t *tccp;
  opj_poc_t *tcp_poc;
  opj_tcp_t *tcp;
  size_t array_size;
  opj_cp_t *cp;
  int numpocs_tile;
  int tileno;
  int j;
  int i;
  int local_54;
  int local_28;
  int iVar10;
  uint uVar11;
  
  if (((in_RDI != 0) && (in_RSI != (int *)0x0)) && (in_RDX != 0)) {
    piVar4 = (int *)calloc(1,0x90);
    *(int **)(in_RDI + 0x60) = piVar4;
    piVar4[0x12] = 1;
    piVar4[0x13] = 1;
    *piVar4 = in_RSI[0x123f];
    piVar4[1] = in_RSI[0x1240];
    piVar4[3] = in_RSI[0x1241];
    piVar4[6] = in_RSI[5];
    piVar4[7] = in_RSI[6];
    piVar4[8] = in_RSI[7];
    if (*(long *)(in_RSI + 8) != 0) {
      sVar5 = (long)(in_RSI[0x4af] * in_RSI[0x578] * 3) << 2;
      pvVar6 = malloc(sVar5);
      *(void **)(piVar4 + 0x22) = pvVar6;
      memcpy(*(void **)(piVar4 + 0x22),*(void **)(in_RSI + 8),sVar5);
    }
    piVar4[0xe] = in_RSI[3];
    piVar4[0xf] = in_RSI[4];
    piVar4[0xc] = in_RSI[1];
    piVar4[0xd] = in_RSI[2];
    if (*(long *)(in_RSI + 10) != 0) {
      sVar5 = strlen(*(char **)(in_RSI + 10));
      pvVar6 = malloc(sVar5 + 1);
      *(void **)(piVar4 + 0x10) = pvVar6;
      if (*(long *)(piVar4 + 0x10) != 0) {
        strcpy(*(char **)(piVar4 + 0x10),*(char **)(in_RSI + 10));
      }
    }
    if (*in_RSI == 0) {
      piVar4[0xe] = *(int *)(in_RDX + 8) - piVar4[0xc];
      piVar4[0xf] = *(int *)(in_RDX + 0xc) - piVar4[0xd];
    }
    else {
      iVar1 = int_ceildiv(*(int *)(in_RDX + 8) - piVar4[0xc],piVar4[0xe]);
      piVar4[0x12] = iVar1;
      iVar1 = int_ceildiv(*(int *)(in_RDX + 0xc) - piVar4[0xd],piVar4[0xf]);
      piVar4[0x13] = iVar1;
    }
    if ((char)in_RSI[0x1242] != '\0') {
      *(undefined1 *)((long)piVar4 + 0x11) = *(undefined1 *)((long)in_RSI + 0x4909);
      *(undefined1 *)(piVar4 + 4) = 1;
    }
    piVar4[2] = 0;
    for (uVar11 = 0; uVar11 < *(uint *)(in_RDX + 0x10); uVar11 = uVar11 + 1) {
      piVar4[2] = *(int *)(*(long *)(in_RDX + 0x18) + (long)(int)uVar11 * 0x38 + 8) *
                  *(int *)(*(long *)(in_RDX + 0x18) + (long)(int)uVar11 * 0x38 + 0xc) *
                  *(int *)(*(long *)(in_RDX + 0x18) + (long)(int)uVar11 * 0x38 + 0x18) + piVar4[2];
    }
    pvVar6 = calloc((long)(piVar4[0x12] * piVar4[0x13]),0x15e8);
    *(void **)(piVar4 + 0x20) = pvVar6;
    for (iVar1 = 0; iVar1 < piVar4[0x12] * piVar4[0x13]; iVar1 = iVar1 + 1) {
      lVar7 = *(long *)(piVar4 + 0x20) + (long)iVar1 * 0x15e8;
      *(int *)(lVar7 + 0xc) = in_RSI[0x4af];
      for (iVar10 = 0; iVar10 < *(int *)(lVar7 + 0xc); iVar10 = iVar10 + 1) {
        if (*piVar4 == 0) {
          if (piVar4[8] == 0) {
            *(int *)(lVar7 + 0x14 + (long)iVar10 * 4) = in_RSI[(long)iVar10 + 0x4b0];
          }
          else {
            *(int *)(lVar7 + 0x144c + (long)iVar10 * 4) = in_RSI[(long)iVar10 + 0x514];
          }
        }
        else {
          if (piVar4[8] != 0) {
            *(int *)(lVar7 + 0x144c + (long)iVar10 * 4) = in_RSI[(long)iVar10 + 0x514];
          }
          *(int *)(lVar7 + 0x14 + (long)iVar10 * 4) = in_RSI[(long)iVar10 + 0x4b0];
        }
      }
      *(int *)(lVar7 + 4) = in_RSI[0xc];
      *(int *)(lVar7 + 8) = in_RSI[0xd];
      *(int *)(lVar7 + 0x10) = (int)*(char *)((long)in_RSI + 0x490a);
      local_28 = 0;
      *(undefined4 *)(lVar7 + 0x1a8) = 0;
      if (in_RSI[0x4ae] == 0) {
        *(undefined4 *)(lVar7 + 0x1a4) = 0;
      }
      else {
        *(undefined4 *)(lVar7 + 0x1a8) = 1;
        for (iVar10 = 0; iVar10 < in_RSI[0x4ae]; iVar10 = iVar10 + 1) {
          if ((iVar1 == in_RSI[(long)iVar10 * 0x25 + 0x1a] + -1) ||
             (in_RSI[(long)iVar10 * 0x25 + 0x1a] == -1)) {
            piVar8 = (int *)(lVar7 + 0x1ac + (long)local_28 * 0x94);
            *piVar8 = in_RSI[(long)local_28 * 0x25 + 0xe];
            piVar8[1] = in_RSI[(long)local_28 * 0x25 + 0xf];
            piVar8[2] = in_RSI[(long)local_28 * 0x25 + 0x10];
            piVar8[3] = in_RSI[(long)local_28 * 0x25 + 0x11];
            piVar8[4] = in_RSI[(long)local_28 * 0x25 + 0x12];
            piVar8[8] = in_RSI[(long)local_28 * 0x25 + 0x16];
            piVar8[0xc] = in_RSI[(long)local_28 * 0x25 + 0x1a];
            local_28 = local_28 + 1;
          }
        }
        *(int *)(lVar7 + 0x1a4) = local_28 + -1;
      }
      pvVar6 = calloc((ulong)*(uint *)(in_RDX + 0x10),0x438);
      *(void **)(lVar7 + 0x15e0) = pvVar6;
      for (uVar11 = 0; uVar11 < *(uint *)(in_RDX + 0x10); uVar11 = uVar11 + 1) {
        puVar9 = (uint *)(*(long *)(lVar7 + 0x15e0) + (long)(int)uVar11 * 0x438);
        *puVar9 = in_RSI[0xc] & 1;
        puVar9[1] = in_RSI[0x578];
        uVar2 = int_floorlog2(in_RSI[0x579]);
        puVar9[2] = uVar2;
        uVar2 = int_floorlog2(in_RSI[0x57a]);
        puVar9[3] = uVar2;
        puVar9[4] = in_RSI[0x57b];
        puVar9[5] = (uint)(in_RSI[0x57c] == 0);
        uVar2 = 0;
        if (in_RSI[0x57c] != 0) {
          uVar2 = 2;
        }
        puVar9[6] = uVar2;
        puVar9[0xc9] = 2;
        if (uVar11 == in_RSI[0x57d]) {
          puVar9[0xca] = in_RSI[0x57e];
        }
        else {
          puVar9[0xca] = 0;
        }
        if (in_RSI[0x123f] == 0) {
          if ((in_RSI[0xc] & 1U) == 0) {
            for (uVar2 = 0; uVar2 < puVar9[1]; uVar2 = uVar2 + 1) {
              puVar9[(long)(int)uVar2 + 0xcb] = 0xf;
              puVar9[(long)(int)uVar2 + 0xec] = 0xf;
            }
          }
          else {
            local_54 = 0;
            uVar2 = puVar9[1];
            while (uVar2 = uVar2 - 1, -1 < (int)uVar2) {
              if (local_54 < in_RSI[0x57f]) {
                if (in_RSI[(long)local_54 + 0x580] < 1) {
                  puVar9[(long)(int)uVar2 + 0xcb] = 1;
                }
                else {
                  uVar3 = int_floorlog2(in_RSI[(long)local_54 + 0x580]);
                  puVar9[(long)(int)uVar2 + 0xcb] = uVar3;
                }
                if (in_RSI[(long)local_54 + 0x5a1] < 1) {
                  puVar9[(long)(int)uVar2 + 0xec] = 1;
                }
                else {
                  uVar3 = int_floorlog2(in_RSI[(long)local_54 + 0x5a1]);
                  puVar9[(long)(int)uVar2 + 0xec] = uVar3;
                }
              }
              else {
                iVar10 = in_RSI[0x57f];
                a = in_RSI[(long)(iVar10 + -1) + 0x580] >>
                    ((char)local_54 - ((char)iVar10 + -1) & 0x1fU);
                iVar10 = in_RSI[(long)(iVar10 + -1) + 0x5a1] >>
                         ((char)local_54 - ((char)iVar10 + -1) & 0x1fU);
                if (a < 1) {
                  puVar9[(long)(int)uVar2 + 0xcb] = 1;
                }
                else {
                  uVar3 = int_floorlog2(a);
                  puVar9[(long)(int)uVar2 + 0xcb] = uVar3;
                }
                if (iVar10 < 1) {
                  puVar9[(long)(int)uVar2 + 0xec] = 1;
                }
                else {
                  uVar3 = int_floorlog2(iVar10);
                  puVar9[(long)(int)uVar2 + 0xec] = uVar3;
                }
              }
              local_54 = local_54 + 1;
            }
          }
        }
        else {
          puVar9[0xcb] = 7;
          puVar9[0xec] = 7;
          for (uVar2 = 1; uVar2 < puVar9[1]; uVar2 = uVar2 + 1) {
            puVar9[(long)(int)uVar2 + 0xcb] = 8;
            puVar9[(long)(int)uVar2 + 0xec] = 8;
          }
        }
        dwt_calc_explicit_stepsizes((opj_tccp_t *)CONCAT44(uVar11,uVar2),iVar1);
      }
    }
  }
  return;
}

Assistant:

void j2k_setup_encoder(opj_j2k_t *j2k, opj_cparameters_t *parameters, opj_image_t *image) {
	int i, j, tileno, numpocs_tile;
	opj_cp_t *cp = NULL;

	if(!j2k || !parameters || ! image) {
		return;
	}

	/* create and initialize the coding parameters structure */
	cp = (opj_cp_t*) opj_calloc(1, sizeof(opj_cp_t));

	/* keep a link to cp so that we can destroy it later in j2k_destroy_compress */
	j2k->cp = cp;

	/* set default values for cp */
	cp->tw = 1;
	cp->th = 1;

	/* 
	copy user encoding parameters 
	*/
	cp->cinema = parameters->cp_cinema;
	cp->max_comp_size =	parameters->max_comp_size;
	cp->rsiz   = parameters->cp_rsiz;
	cp->disto_alloc = parameters->cp_disto_alloc;
	cp->fixed_alloc = parameters->cp_fixed_alloc;
	cp->fixed_quality = parameters->cp_fixed_quality;

	/* mod fixed_quality */
	if(parameters->cp_matrice) {
		size_t array_size = parameters->tcp_numlayers * parameters->numresolution * 3 * sizeof(int);
		cp->matrice = (int *) opj_malloc(array_size);
		memcpy(cp->matrice, parameters->cp_matrice, array_size);
	}

	/* tiles */
	cp->tdx = parameters->cp_tdx;
	cp->tdy = parameters->cp_tdy;

	/* tile offset */
	cp->tx0 = parameters->cp_tx0;
	cp->ty0 = parameters->cp_ty0;

	/* comment string */
	if(parameters->cp_comment) {
		cp->comment = (char*)opj_malloc(strlen(parameters->cp_comment) + 1);
		if(cp->comment) {
			strcpy(cp->comment, parameters->cp_comment);
		}
	}

	/*
	calculate other encoding parameters
	*/

	if (parameters->tile_size_on) {
		cp->tw = int_ceildiv(image->x1 - cp->tx0, cp->tdx);
		cp->th = int_ceildiv(image->y1 - cp->ty0, cp->tdy);
	} else {
		cp->tdx = image->x1 - cp->tx0;
		cp->tdy = image->y1 - cp->ty0;
	}

	if(parameters->tp_on){
		cp->tp_flag = parameters->tp_flag;
		cp->tp_on = 1;
	}
	
	cp->img_size = 0;
	for(i=0;i<image->numcomps ;i++){
	cp->img_size += (image->comps[i].w *image->comps[i].h * image->comps[i].prec);
	}


#ifdef USE_JPWL
	/*
	calculate JPWL encoding parameters
	*/

	if (parameters->jpwl_epc_on) {
		int i;

		/* set JPWL on */
		cp->epc_on = OPJ_TRUE;
		cp->info_on = OPJ_FALSE; /* no informative technique */

		/* set EPB on */
		if ((parameters->jpwl_hprot_MH > 0) || (parameters->jpwl_hprot_TPH[0] > 0)) {
			cp->epb_on = OPJ_TRUE;
			
			cp->hprot_MH = parameters->jpwl_hprot_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->hprot_TPH_tileno[i] = parameters->jpwl_hprot_TPH_tileno[i];
				cp->hprot_TPH[i] = parameters->jpwl_hprot_TPH[i];
			}
			/* if tile specs are not specified, copy MH specs */
			if (cp->hprot_TPH[0] == -1) {
				cp->hprot_TPH_tileno[0] = 0;
				cp->hprot_TPH[0] = parameters->jpwl_hprot_MH;
			}
			for (i = 0; i < JPWL_MAX_NO_PACKSPECS; i++) {
				cp->pprot_tileno[i] = parameters->jpwl_pprot_tileno[i];
				cp->pprot_packno[i] = parameters->jpwl_pprot_packno[i];
				cp->pprot[i] = parameters->jpwl_pprot[i];
			}
		}

		/* set ESD writing */
		if ((parameters->jpwl_sens_size == 1) || (parameters->jpwl_sens_size == 2)) {
			cp->esd_on = OPJ_TRUE;

			cp->sens_size = parameters->jpwl_sens_size;
			cp->sens_addr = parameters->jpwl_sens_addr;
			cp->sens_range = parameters->jpwl_sens_range;

			cp->sens_MH = parameters->jpwl_sens_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->sens_TPH_tileno[i] = parameters->jpwl_sens_TPH_tileno[i];
				cp->sens_TPH[i] = parameters->jpwl_sens_TPH[i];
			}
		}

		/* always set RED writing to false: we are at the encoder */
		cp->red_on = OPJ_FALSE;

	} else {
		cp->epc_on = OPJ_FALSE;
	}
#endif /* USE_JPWL */


	/* initialize the mutiple tiles */
	/* ---------------------------- */
	cp->tcps = (opj_tcp_t*) opj_calloc(cp->tw * cp->th, sizeof(opj_tcp_t));

	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		opj_tcp_t *tcp = &cp->tcps[tileno];
		tcp->numlayers = parameters->tcp_numlayers;
		for (j = 0; j < tcp->numlayers; j++) {
			if(cp->cinema){
				if (cp->fixed_quality) {
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				}
				tcp->rates[j] = parameters->tcp_rates[j];
			}else{
				if (cp->fixed_quality) {	/* add fixed_quality */
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				} else {
					tcp->rates[j] = parameters->tcp_rates[j];
				}
			}
		}
		tcp->csty = parameters->csty;
		tcp->prg = parameters->prog_order;
		tcp->mct = parameters->tcp_mct; 

		numpocs_tile = 0;
		tcp->POC = 0;
		if (parameters->numpocs) {
			/* initialisation of POC */
			tcp->POC = 1;
			for (i = 0; i < parameters->numpocs; i++) {
				if((tileno == parameters->POC[i].tile - 1) || (parameters->POC[i].tile == -1)) {
					opj_poc_t *tcp_poc = &tcp->pocs[numpocs_tile];
					tcp_poc->resno0		= parameters->POC[numpocs_tile].resno0;
					tcp_poc->compno0	= parameters->POC[numpocs_tile].compno0;
					tcp_poc->layno1		= parameters->POC[numpocs_tile].layno1;
					tcp_poc->resno1		= parameters->POC[numpocs_tile].resno1;
					tcp_poc->compno1	= parameters->POC[numpocs_tile].compno1;
					tcp_poc->prg1		= parameters->POC[numpocs_tile].prg1;
					tcp_poc->tile		= parameters->POC[numpocs_tile].tile;
					numpocs_tile++;
				}
			}
			tcp->numpocs = numpocs_tile -1 ;
		}else{ 
			tcp->numpocs = 0;
		}

		tcp->tccps = (opj_tccp_t*) opj_calloc(image->numcomps, sizeof(opj_tccp_t));

		for (i = 0; i < image->numcomps; i++) {
			opj_tccp_t *tccp = &tcp->tccps[i];
			tccp->csty = parameters->csty & 0x01;	/* 0 => one precinct || 1 => custom precinct  */
			tccp->numresolutions = parameters->numresolution;
			tccp->cblkw = int_floorlog2(parameters->cblockw_init);
			tccp->cblkh = int_floorlog2(parameters->cblockh_init);
			tccp->cblksty = parameters->mode;
			tccp->qmfbid = parameters->irreversible ? 0 : 1;
			tccp->qntsty = parameters->irreversible ? J2K_CCP_QNTSTY_SEQNT : J2K_CCP_QNTSTY_NOQNT;
			tccp->numgbits = 2;
			if (i == parameters->roi_compno) {
				tccp->roishift = parameters->roi_shift;
			} else {
				tccp->roishift = 0;
			}

			if(parameters->cp_cinema)
			{
				/*Precinct size for lowest frequency subband=128*/
				tccp->prcw[0] = 7;
				tccp->prch[0] = 7;
				/*Precinct size at all other resolutions = 256*/
				for (j = 1; j < tccp->numresolutions; j++) {
					tccp->prcw[j] = 8;
					tccp->prch[j] = 8;
				}
			}else{
				if (parameters->csty & J2K_CCP_CSTY_PRT) {
					int p = 0;
					for (j = tccp->numresolutions - 1; j >= 0; j--) {
						if (p < parameters->res_spec) {
							
							if (parameters->prcw_init[p] < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(parameters->prcw_init[p]);
							}
							
							if (parameters->prch_init[p] < 1) {
								tccp->prch[j] = 1;
							}else {
								tccp->prch[j] = int_floorlog2(parameters->prch_init[p]);
							}

						} else {
							int res_spec = parameters->res_spec;
							int size_prcw = parameters->prcw_init[res_spec - 1] >> (p - (res_spec - 1));
							int size_prch = parameters->prch_init[res_spec - 1] >> (p - (res_spec - 1));
							
							if (size_prcw < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(size_prcw);
							}
							
							if (size_prch < 1) {
								tccp->prch[j] = 1;
							} else {
								tccp->prch[j] = int_floorlog2(size_prch);
							}
						}
						p++;
						/*printf("\nsize precinct for level %d : %d,%d\n", j,tccp->prcw[j], tccp->prch[j]); */
					}	/*end for*/
				} else {
					for (j = 0; j < tccp->numresolutions; j++) {
						tccp->prcw[j] = 15;
						tccp->prch[j] = 15;
					}
				}
			}

			dwt_calc_explicit_stepsizes(tccp, image->comps[i].prec);
		}
	}
}